

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx2::ConeCurveMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *line)

{
  float fVar1;
  undefined1 auVar2 [16];
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Scene *pSVar11;
  Geometry *pGVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  float fVar71;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar87;
  float fVar96;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined4 uVar97;
  float fVar98;
  float fVar99;
  float fVar106;
  float fVar108;
  float fVar110;
  float fVar112;
  float fVar114;
  float fVar116;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar107;
  float fVar109;
  float fVar111;
  float fVar113;
  float fVar115;
  float fVar117;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar121;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar122;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  float fVar144;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar159;
  float fVar160;
  undefined1 auVar161 [28];
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar171;
  float fVar172;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar166;
  float fVar168;
  float fVar170;
  float fVar173;
  undefined1 auVar164 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar188 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  Scene *scene;
  RoundLineIntersectorHitM<8> hit;
  int local_60c;
  RayQueryContext *local_608;
  RTCFilterFunctionNArguments local_600;
  float local_5d0;
  undefined4 local_5cc;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  uint local_5bc;
  uint local_5b8;
  uint local_5b4;
  uint local_5b0;
  undefined1 local_5a0 [32];
  Scene *local_568;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 auStack_4b0 [8];
  float fStack_4a8;
  undefined4 uStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  uint local_1c0 [4];
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar90 [32];
  
  local_608 = context;
  pSVar11 = context->scene;
  local_1c0[0] = line->sharedGeomID;
  uVar69 = (line->v0).field_0.i[0];
  local_568 = pSVar11;
  pGVar12 = (pSVar11->geometries).items[local_1c0[0]].ptr;
  lVar13 = *(long *)&pGVar12[1].time_range.upper;
  p_Var14 = pGVar12[1].intersectionFilterN;
  uVar68 = (line->v0).field_0.i[1];
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[4];
  uVar7 = (line->v0).field_0.i[5];
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar6 * (long)p_Var14);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar69 * (long)p_Var14);
  auVar88._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar7 * (long)p_Var14);
  auVar88._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar68 * (long)p_Var14);
  uVar8 = (line->v0).field_0.i[6];
  auVar100._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar8 * (long)p_Var14);
  auVar100._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar5 * (long)p_Var14);
  uVar9 = (line->v0).field_0.i[3];
  uVar10 = (line->v0).field_0.i[7];
  auVar103._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar10 * (long)p_Var14);
  auVar103._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * (long)p_Var14);
  auVar2 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar6 + 1) * (long)p_Var14);
  auVar123._0_16_ =
       ZEXT116(0) * auVar2 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar13 + (ulong)(uVar69 + 1) * (long)p_Var14);
  auVar123._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar2 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar7 + 1) * (long)p_Var14);
  auVar154._0_16_ =
       ZEXT116(0) * auVar2 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar13 + (ulong)(uVar68 + 1) * (long)p_Var14);
  auVar154._16_16_ = ZEXT116(1) * auVar2;
  auVar2 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar8 + 1) * (long)p_Var14);
  auVar162._0_16_ =
       ZEXT116(0) * auVar2 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar13 + (ulong)(uVar5 + 1) * (long)p_Var14);
  auVar162._16_16_ = ZEXT116(1) * auVar2;
  auVar2 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar10 + 1) * (long)p_Var14);
  auVar145._0_16_ =
       ZEXT116(0) * auVar2 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar13 + (ulong)(uVar9 + 1) * (long)p_Var14);
  auVar145._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar151 = vunpcklps_avx(auVar72,auVar100);
  auVar94 = vunpckhps_avx(auVar72,auVar100);
  auVar156 = vunpcklps_avx(auVar88,auVar103);
  auVar77 = vunpckhps_avx(auVar88,auVar103);
  auVar176 = vunpcklps_avx(auVar151,auVar156);
  auVar151 = vunpckhps_avx(auVar151,auVar156);
  auVar179 = vunpcklps_avx(auVar94,auVar77);
  auVar156 = vunpckhps_avx(auVar94,auVar77);
  auVar72 = vpunpckldq_avx2(auVar123,auVar162);
  auVar94 = vpunpckhdq_avx2(auVar123,auVar162);
  auVar88 = vpunpckldq_avx2(auVar154,auVar145);
  auVar77 = vpunpckhdq_avx2(auVar154,auVar145);
  auVar103 = vpunpckldq_avx2(auVar72,auVar88);
  auVar88 = vpunpckhdq_avx2(auVar72,auVar88);
  auVar123 = vpunpckldq_avx2(auVar94,auVar77);
  auVar100 = vpunpckhdq_avx2(auVar94,auVar77);
  uVar3 = line->leftExists;
  uVar4 = line->rightExists;
  auVar94 = vpcmpeqd_avx2(auVar94,auVar94);
  auVar72 = vpcmpeqd_avx2(auVar94,(undefined1  [32])(line->primIDs).field_0);
  local_1c0[1] = local_1c0[0];
  local_1c0[2] = local_1c0[0];
  local_1c0[3] = local_1c0[0];
  uStack_1b0 = local_1c0[0];
  uStack_1ac = local_1c0[0];
  uStack_1a8 = local_1c0[0];
  uStack_1a4 = local_1c0[0];
  auVar94._0_16_ = *(undefined1 (*) [16])&(ray->super_RayK<1>).dir;
  auVar94._16_4_ = (ray->super_RayK<1>).tfar;
  auVar94._20_4_ = (ray->super_RayK<1>).mask;
  auVar94._24_4_ = (ray->super_RayK<1>).id;
  auVar94._28_4_ = (ray->super_RayK<1>).flags;
  auVar77 = *(undefined1 (*) [32])((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  fVar129 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar131 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar1 = (ray->super_RayK<1>).tfar;
  fVar132 = (float)(ray->super_RayK<1>).mask;
  fVar144 = (float)(ray->super_RayK<1>).id;
  fVar133 = (float)(ray->super_RayK<1>).flags;
  fVar15 = (ray->Ng).field_0.field_0.x;
  auVar101._4_4_ = fVar131 * fVar131;
  auVar101._0_4_ = fVar129 * fVar129;
  auVar101._8_4_ = fVar1 * fVar1;
  auVar101._12_4_ = fVar132 * fVar132;
  auVar101._16_4_ = fVar144 * fVar144;
  auVar101._20_4_ = fVar133 * fVar133;
  auVar101._24_4_ = fVar15 * fVar15;
  auVar101._28_4_ = (ray->Ng).field_0.field_0.y;
  auVar2 = vfmadd231ps_fma(auVar101,auVar77,auVar77);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar94,auVar94);
  uVar97 = auVar2._0_4_;
  auVar73._4_4_ = uVar97;
  auVar73._0_4_ = uVar97;
  auVar73._8_4_ = uVar97;
  auVar73._12_4_ = uVar97;
  auVar73._16_4_ = uVar97;
  auVar73._20_4_ = uVar97;
  auVar73._24_4_ = uVar97;
  auVar73._28_4_ = uVar97;
  auVar94 = vrcpps_avx(auVar73);
  fVar129 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar89._4_4_ = fVar129;
  auVar89._0_4_ = fVar129;
  auVar89._8_4_ = fVar129;
  auVar89._12_4_ = fVar129;
  auVar89._16_4_ = fVar129;
  auVar89._20_4_ = fVar129;
  auVar89._24_4_ = fVar129;
  auVar89._28_4_ = fVar129;
  auVar124._8_4_ = 0x3f800000;
  auVar124._0_8_ = &DAT_3f8000003f800000;
  auVar124._12_4_ = 0x3f800000;
  auVar124._16_4_ = 0x3f800000;
  auVar124._20_4_ = 0x3f800000;
  auVar124._24_4_ = 0x3f800000;
  auVar124._28_4_ = 0x3f800000;
  auVar2 = vfnmadd213ps_fma(auVar73,auVar94,auVar124);
  auVar2 = vfmadd132ps_fma(ZEXT1632(auVar2),auVar94,auVar94);
  auVar135._4_4_ = (auVar103._4_4_ + auVar176._4_4_) * 0.5;
  auVar135._0_4_ = (auVar103._0_4_ + auVar176._0_4_) * 0.5;
  auVar135._8_4_ = (auVar103._8_4_ + auVar176._8_4_) * 0.5;
  auVar135._12_4_ = (auVar103._12_4_ + auVar176._12_4_) * 0.5;
  auVar135._16_4_ = (auVar103._16_4_ + auVar176._16_4_) * 0.5;
  auVar135._20_4_ = (auVar103._20_4_ + auVar176._20_4_) * 0.5;
  auVar135._24_4_ = (auVar103._24_4_ + auVar176._24_4_) * 0.5;
  auVar135._28_4_ = auVar103._28_4_ + auVar176._28_4_;
  auVar77._4_4_ = (auVar88._4_4_ + auVar151._4_4_) * 0.5;
  auVar77._0_4_ = (auVar88._0_4_ + auVar151._0_4_) * 0.5;
  auVar77._8_4_ = (auVar88._8_4_ + auVar151._8_4_) * 0.5;
  auVar77._12_4_ = (auVar88._12_4_ + auVar151._12_4_) * 0.5;
  auVar77._16_4_ = (auVar88._16_4_ + auVar151._16_4_) * 0.5;
  auVar77._20_4_ = (auVar88._20_4_ + auVar151._20_4_) * 0.5;
  auVar77._24_4_ = (auVar88._24_4_ + auVar151._24_4_) * 0.5;
  auVar77._28_4_ = auVar88._28_4_ + auVar151._28_4_;
  auVar33._4_4_ = (auVar123._4_4_ + auVar179._4_4_) * 0.5;
  auVar33._0_4_ = (auVar123._0_4_ + auVar179._0_4_) * 0.5;
  auVar33._8_4_ = (auVar123._8_4_ + auVar179._8_4_) * 0.5;
  auVar33._12_4_ = (auVar123._12_4_ + auVar179._12_4_) * 0.5;
  auVar33._16_4_ = (auVar123._16_4_ + auVar179._16_4_) * 0.5;
  auVar33._20_4_ = (auVar123._20_4_ + auVar179._20_4_) * 0.5;
  auVar33._24_4_ = (auVar123._24_4_ + auVar179._24_4_) * 0.5;
  auVar33._28_4_ = auVar123._28_4_ + auVar179._28_4_;
  fVar131 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar174._4_4_ = fVar131;
  auVar174._0_4_ = fVar131;
  auVar174._8_4_ = fVar131;
  auVar174._12_4_ = fVar131;
  auVar174._16_4_ = fVar131;
  auVar174._20_4_ = fVar131;
  auVar174._24_4_ = fVar131;
  auVar174._28_4_ = fVar131;
  auVar94 = vsubps_avx(auVar77,auVar89);
  auVar77 = vsubps_avx(auVar33,auVar174);
  local_2a0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar34._4_4_ = auVar77._4_4_ * local_2a0;
  auVar34._0_4_ = auVar77._0_4_ * local_2a0;
  auVar34._8_4_ = auVar77._8_4_ * local_2a0;
  auVar34._12_4_ = auVar77._12_4_ * local_2a0;
  auVar34._16_4_ = auVar77._16_4_ * local_2a0;
  auVar34._20_4_ = auVar77._20_4_ * local_2a0;
  auVar34._24_4_ = auVar77._24_4_ * local_2a0;
  auVar34._28_4_ = auVar77._28_4_;
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_440._4_4_ = fVar1;
  local_440._0_4_ = fVar1;
  local_440._8_4_ = fVar1;
  local_440._12_4_ = fVar1;
  local_440._16_4_ = fVar1;
  local_440._20_4_ = fVar1;
  local_440._24_4_ = fVar1;
  local_440._28_4_ = fVar1;
  auVar30 = vfmadd231ps_fma(auVar34,local_440,auVar94);
  fVar132 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar125._4_4_ = fVar132;
  auVar125._0_4_ = fVar132;
  auVar125._8_4_ = fVar132;
  auVar125._12_4_ = fVar132;
  auVar125._16_4_ = fVar132;
  auVar125._20_4_ = fVar132;
  auVar125._24_4_ = fVar132;
  auVar125._28_4_ = fVar132;
  fVar144 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_460._4_4_ = fVar144;
  local_460._0_4_ = fVar144;
  local_460._8_4_ = fVar144;
  local_460._12_4_ = fVar144;
  local_460._16_4_ = fVar144;
  local_460._20_4_ = fVar144;
  local_460._24_4_ = fVar144;
  local_460._28_4_ = fVar144;
  auVar94 = vsubps_avx(auVar135,auVar125);
  auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),local_460,auVar94);
  local_340 = auVar30._0_4_ * auVar2._0_4_;
  fStack_33c = auVar30._4_4_ * auVar2._4_4_;
  fStack_338 = auVar30._8_4_ * auVar2._8_4_;
  fStack_334 = auVar30._12_4_ * auVar2._12_4_;
  fStack_324 = auVar145._28_4_;
  auVar74._0_4_ = fVar132 + fVar144 * local_340;
  auVar74._4_4_ = fVar132 + fVar144 * fStack_33c;
  auVar74._8_4_ = fVar132 + fVar144 * fStack_338;
  auVar74._12_4_ = fVar132 + fVar144 * fStack_334;
  auVar74._16_4_ = fVar132 + fVar144 * 0.0;
  auVar74._20_4_ = fVar132 + fVar144 * 0.0;
  auVar74._24_4_ = fVar132 + fVar144 * 0.0;
  auVar74._28_4_ = fVar132 + 0.0;
  auVar126._0_4_ = fVar129 + fVar1 * local_340;
  auVar126._4_4_ = fVar129 + fVar1 * fStack_33c;
  auVar126._8_4_ = fVar129 + fVar1 * fStack_338;
  auVar126._12_4_ = fVar129 + fVar1 * fStack_334;
  auVar126._16_4_ = fVar129 + fVar1 * 0.0;
  auVar126._20_4_ = fVar129 + fVar1 * 0.0;
  auVar126._24_4_ = fVar129 + fVar1 * 0.0;
  auVar126._28_4_ = fVar129 + auVar94._28_4_;
  uStack_330 = 0;
  uStack_32c = 0;
  uStack_328 = 0;
  auVar175._0_4_ = fVar131 + local_2a0 * local_340;
  auVar175._4_4_ = fVar131 + local_2a0 * fStack_33c;
  auVar175._8_4_ = fVar131 + local_2a0 * fStack_338;
  auVar175._12_4_ = fVar131 + local_2a0 * fStack_334;
  auVar175._16_4_ = fVar131 + local_2a0 * 0.0;
  auVar175._20_4_ = fVar131 + local_2a0 * 0.0;
  auVar175._24_4_ = fVar131 + local_2a0 * 0.0;
  auVar175._28_4_ = fVar131 + fVar129;
  local_2e0 = vsubps_avx(auVar103,auVar176);
  _local_480 = vsubps_avx(auVar74,auVar176);
  local_300 = vsubps_avx(auVar88,auVar151);
  _local_4a0 = vsubps_avx(auVar126,auVar151);
  local_320 = vsubps_avx(auVar123,auVar179);
  local_2c0 = vsubps_avx(auVar175,auVar179);
  fVar15 = local_320._0_4_;
  fVar17 = local_320._4_4_;
  auVar176._4_4_ = fVar17 * fVar17;
  auVar176._0_4_ = fVar15 * fVar15;
  fVar19 = local_320._8_4_;
  auVar176._8_4_ = fVar19 * fVar19;
  fVar21 = local_320._12_4_;
  auVar176._12_4_ = fVar21 * fVar21;
  fVar23 = local_320._16_4_;
  auVar176._16_4_ = fVar23 * fVar23;
  fVar25 = local_320._20_4_;
  auVar176._20_4_ = fVar25 * fVar25;
  fVar27 = local_320._24_4_;
  auVar176._24_4_ = fVar27 * fVar27;
  auVar176._28_4_ = auVar151._28_4_;
  auVar2 = vfmadd231ps_fma(auVar176,local_300,local_300);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),local_2e0,local_2e0);
  fVar16 = local_2c0._0_4_;
  fVar18 = local_2c0._4_4_;
  auVar151._4_4_ = fVar17 * fVar18;
  auVar151._0_4_ = fVar15 * fVar16;
  fVar20 = local_2c0._8_4_;
  auVar151._8_4_ = fVar19 * fVar20;
  fVar22 = local_2c0._12_4_;
  auVar151._12_4_ = fVar21 * fVar22;
  fVar24 = local_2c0._16_4_;
  auVar151._16_4_ = fVar23 * fVar24;
  fVar26 = local_2c0._20_4_;
  auVar151._20_4_ = fVar25 * fVar26;
  fVar28 = local_2c0._24_4_;
  auVar151._24_4_ = fVar27 * fVar28;
  auVar151._28_4_ = auVar175._28_4_;
  auVar30 = vfmadd231ps_fma(auVar151,_local_4a0,local_300);
  auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),_local_480,local_2e0);
  auVar179._4_4_ = fVar17 * local_2a0;
  auVar179._0_4_ = fVar15 * local_2a0;
  auVar179._8_4_ = fVar19 * local_2a0;
  auVar179._12_4_ = fVar21 * local_2a0;
  auVar179._16_4_ = fVar23 * local_2a0;
  auVar179._20_4_ = fVar25 * local_2a0;
  auVar179._24_4_ = fVar27 * local_2a0;
  auVar179._28_4_ = local_320._28_4_;
  auVar31 = vfmadd231ps_fma(auVar179,local_440,local_300);
  auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),local_460,local_2e0);
  auVar94 = vsubps_avx(auVar156,auVar100);
  fVar134 = auVar94._0_4_;
  fVar166 = auVar94._4_4_;
  fVar170 = auVar94._8_4_;
  fVar172 = auVar94._12_4_;
  fVar187 = auVar94._16_4_;
  fVar190 = auVar94._20_4_;
  fVar192 = auVar94._24_4_;
  fVar129 = auVar2._0_4_;
  fVar71 = fVar134 * fVar134 + fVar129;
  fVar131 = auVar2._4_4_;
  fVar81 = fVar166 * fVar166 + fVar131;
  fVar132 = auVar2._8_4_;
  fVar82 = fVar170 * fVar170 + fVar132;
  fVar133 = auVar2._12_4_;
  fVar83 = fVar172 * fVar172 + fVar133;
  fVar84 = fVar187 * fVar187 + 0.0;
  fVar85 = fVar190 * fVar190 + 0.0;
  fVar86 = fVar192 * fVar192 + 0.0;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  auVar35._4_4_ = local_2a0 * fVar18;
  auVar35._0_4_ = local_2a0 * fVar16;
  auVar35._8_4_ = local_2a0 * fVar20;
  auVar35._12_4_ = local_2a0 * fVar22;
  auVar35._16_4_ = local_2a0 * fVar24;
  auVar35._20_4_ = local_2a0 * fVar26;
  auVar35._24_4_ = local_2a0 * fVar28;
  auVar35._28_4_ = local_2e0._28_4_;
  auVar32 = vfmadd231ps_fma(auVar35,local_440,_local_4a0);
  auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),local_460,_local_480);
  fVar186 = fVar129 * fVar129;
  fVar189 = fVar131 * fVar131;
  fVar191 = fVar132 * fVar132;
  fVar193 = fVar133 * fVar133;
  uStack_1c4 = local_2a0;
  _local_1e0 = ZEXT1628(CONCAT412(fVar193,CONCAT48(fVar191,CONCAT44(fVar189,fVar186))));
  fVar160 = auVar30._0_4_;
  fVar159 = auVar31._0_4_;
  fVar168 = auVar30._4_4_;
  fVar165 = auVar31._4_4_;
  fVar171 = auVar30._8_4_;
  fVar167 = auVar31._8_4_;
  fVar173 = auVar30._12_4_;
  fVar169 = auVar31._12_4_;
  fVar36 = local_300._28_4_;
  auVar37._4_4_ = fVar81 * fVar165 * fVar168;
  auVar37._0_4_ = fVar71 * fVar159 * fVar160;
  auVar37._8_4_ = fVar82 * fVar167 * fVar171;
  auVar37._12_4_ = fVar83 * fVar169 * fVar173;
  auVar37._16_4_ = fVar84 * 0.0;
  auVar37._20_4_ = fVar85 * 0.0;
  auVar37._24_4_ = fVar86 * 0.0;
  auVar37._28_4_ = fVar36;
  auVar77 = vsubps_avx(ZEXT1632(CONCAT412(fVar193 * auVar32._12_4_,
                                          CONCAT48(fVar191 * auVar32._8_4_,
                                                   CONCAT44(fVar189 * auVar32._4_4_,
                                                            fVar186 * auVar32._0_4_)))),auVar37);
  auVar135 = ZEXT1632(auVar2);
  fVar99 = auVar156._0_4_;
  fVar98 = fVar99 * fVar129;
  fVar107 = auVar156._4_4_;
  fVar106 = fVar107 * fVar131;
  auVar38._4_4_ = fVar106;
  auVar38._0_4_ = fVar98;
  fVar109 = auVar156._8_4_;
  fVar108 = fVar109 * fVar132;
  auVar38._8_4_ = fVar108;
  fVar111 = auVar156._12_4_;
  fVar110 = fVar111 * fVar133;
  auVar38._12_4_ = fVar110;
  fVar113 = auVar156._16_4_;
  fVar112 = fVar113 * 0.0;
  auVar38._16_4_ = fVar112;
  fVar115 = auVar156._20_4_;
  fVar114 = fVar115 * 0.0;
  auVar38._20_4_ = fVar114;
  fVar117 = auVar156._24_4_;
  fVar116 = fVar117 * 0.0;
  auVar38._24_4_ = fVar116;
  auVar38._28_4_ = fVar36;
  fVar194 = auVar156._28_4_;
  fVar87 = fVar98 * fVar159 * fVar134 + auVar77._0_4_;
  fVar96 = fVar106 * fVar165 * fVar166 + auVar77._4_4_;
  auVar90._0_8_ = CONCAT44(fVar96,fVar87);
  auVar90._8_4_ = fVar108 * fVar167 * fVar170 + auVar77._8_4_;
  auVar90._12_4_ = fVar110 * fVar169 * fVar172 + auVar77._12_4_;
  auVar90._16_4_ = fVar112 * fVar187 * 0.0 + auVar77._16_4_;
  auVar90._20_4_ = fVar114 * fVar190 * 0.0 + auVar77._20_4_;
  auVar90._24_4_ = fVar116 * fVar192 * 0.0 + auVar77._24_4_;
  auVar90._28_4_ = fVar194 + auVar77._28_4_;
  auVar156._4_4_ = fVar18 * fVar18;
  auVar156._0_4_ = fVar16 * fVar16;
  auVar156._8_4_ = fVar20 * fVar20;
  auVar156._12_4_ = fVar22 * fVar22;
  auVar156._16_4_ = fVar24 * fVar24;
  auVar156._20_4_ = fVar26 * fVar26;
  auVar156._24_4_ = fVar28 * fVar28;
  auVar156._28_4_ = fVar194;
  auVar176 = _local_4a0;
  auVar2 = vfmadd231ps_fma(auVar156,_local_4a0,_local_4a0);
  auVar179 = _local_480;
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),_local_480,_local_480);
  auVar39._4_4_ = fVar81 * fVar168 * fVar168;
  auVar39._0_4_ = fVar71 * fVar160 * fVar160;
  auVar39._8_4_ = fVar82 * fVar171 * fVar171;
  auVar39._12_4_ = fVar83 * fVar173 * fVar173;
  auVar39._16_4_ = fVar84 * 0.0;
  auVar39._20_4_ = fVar85 * 0.0;
  auVar39._24_4_ = fVar86 * 0.0;
  auVar39._28_4_ = local_480._28_4_;
  auVar77 = vsubps_avx(ZEXT1632(CONCAT412(fVar193 * auVar2._12_4_,
                                          CONCAT48(fVar191 * auVar2._8_4_,
                                                   CONCAT44(fVar189 * auVar2._4_4_,
                                                            fVar186 * auVar2._0_4_)))),auVar39);
  fStack_84 = auVar94._28_4_;
  auVar40._4_4_ = fVar168 * (fVar166 + fVar166);
  auVar40._0_4_ = fVar160 * (fVar134 + fVar134);
  auVar40._8_4_ = fVar171 * (fVar170 + fVar170);
  auVar40._12_4_ = fVar173 * (fVar172 + fVar172);
  auVar40._16_4_ = (fVar187 + fVar187) * 0.0;
  auVar40._20_4_ = (fVar190 + fVar190) * 0.0;
  auVar40._24_4_ = (fVar192 + fVar192) * 0.0;
  auVar40._28_4_ = fStack_84 + fStack_84;
  auVar94 = vsubps_avx(auVar40,auVar38);
  fVar121 = auVar77._28_4_;
  fVar122 = fVar159 * fVar159;
  fVar127 = fVar165 * fVar165;
  fVar128 = fVar167 * fVar167;
  fVar130 = fVar169 * fVar169;
  auVar41._4_4_ = fVar81 * fVar127;
  auVar41._0_4_ = fVar71 * fVar122;
  auVar41._8_4_ = fVar82 * fVar128;
  auVar41._12_4_ = fVar83 * fVar130;
  auVar41._16_4_ = fVar84 * 0.0;
  auVar41._20_4_ = fVar85 * 0.0;
  auVar41._24_4_ = fVar86 * 0.0;
  auVar41._28_4_ = fVar121;
  auVar151 = vsubps_avx(_local_1e0,auVar41);
  auVar42._4_4_ = auVar151._4_4_ * (auVar77._4_4_ + fVar106 * auVar94._4_4_);
  auVar42._0_4_ = auVar151._0_4_ * (auVar77._0_4_ + fVar98 * auVar94._0_4_);
  auVar42._8_4_ = auVar151._8_4_ * (auVar77._8_4_ + fVar108 * auVar94._8_4_);
  auVar42._12_4_ = auVar151._12_4_ * (auVar77._12_4_ + fVar110 * auVar94._12_4_);
  auVar42._16_4_ = auVar151._16_4_ * (auVar77._16_4_ + fVar112 * auVar94._16_4_);
  auVar42._20_4_ = auVar151._20_4_ * (auVar77._20_4_ + fVar114 * auVar94._20_4_);
  auVar42._24_4_ = auVar151._24_4_ * (auVar77._24_4_ + fVar116 * auVar94._24_4_);
  auVar42._28_4_ = fVar121 + fVar36;
  auVar43._4_4_ = fVar96 * fVar96;
  auVar43._0_4_ = fVar87 * fVar87;
  auVar43._8_4_ = auVar90._8_4_ * auVar90._8_4_;
  auVar43._12_4_ = auVar90._12_4_ * auVar90._12_4_;
  auVar43._16_4_ = auVar90._16_4_ * auVar90._16_4_;
  auVar43._20_4_ = auVar90._20_4_ * auVar90._20_4_;
  auVar43._24_4_ = auVar90._24_4_ * auVar90._24_4_;
  auVar43._28_4_ = fVar121;
  auVar77 = vsubps_avx(auVar43,auVar42);
  auVar101 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar94 = vcmpps_avx(auVar77,auVar101,5);
  auVar156 = auVar94 & ~auVar72;
  if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar156 >> 0x7f,0) != '\0') ||
        (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar156 >> 0xbf,0) != '\0') ||
      (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar156[0x1f] < '\0')
  {
    auVar94 = vandnps_avx(auVar72,auVar94);
    auVar2 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
    auVar103 = vsubps_avx(auVar74,auVar103);
    auVar72 = vsubps_avx(auVar126,auVar88);
    auVar88 = vsubps_avx(auVar175,auVar123);
    auVar146._2_2_ = 0;
    auVar146._0_2_ = uVar4;
    auVar146._4_2_ = uVar4;
    auVar146._6_2_ = 0;
    auVar146._8_2_ = uVar4;
    auVar146._10_2_ = 0;
    auVar146._12_2_ = uVar4;
    auVar146._14_2_ = 0;
    auVar146._16_2_ = uVar4;
    auVar146._18_2_ = 0;
    auVar146._20_2_ = uVar4;
    auVar146._22_2_ = 0;
    auVar146._24_2_ = uVar4;
    auVar146._26_2_ = 0;
    auVar146._28_2_ = uVar4;
    auVar146._30_2_ = 0;
    auVar156 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar94 = vpand_avx2(auVar156,auVar146);
    auVar94 = vpcmpeqd_avx2(auVar94,auVar101);
    auVar30 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
    auVar147._2_2_ = 0;
    auVar147._0_2_ = uVar3;
    auVar147._4_2_ = uVar3;
    auVar147._6_2_ = 0;
    auVar147._8_2_ = uVar3;
    auVar147._10_2_ = 0;
    auVar147._12_2_ = uVar3;
    auVar147._14_2_ = 0;
    auVar147._16_2_ = uVar3;
    auVar147._18_2_ = 0;
    auVar147._20_2_ = uVar3;
    auVar147._22_2_ = 0;
    auVar147._24_2_ = uVar3;
    auVar147._26_2_ = 0;
    auVar147._28_2_ = uVar3;
    auVar147._30_2_ = 0;
    auVar77 = vsqrtps_avx(auVar77);
    auVar123 = vpand_avx2(auVar156,auVar147);
    auVar94 = vrcpps_avx(auVar151);
    auVar181._8_4_ = 0x3f800000;
    auVar181._0_8_ = &DAT_3f8000003f800000;
    auVar181._12_4_ = 0x3f800000;
    auVar181._16_4_ = 0x3f800000;
    auVar181._20_4_ = 0x3f800000;
    auVar181._24_4_ = 0x3f800000;
    auVar181._28_4_ = 0x3f800000;
    auVar32 = vfnmadd213ps_fma(auVar94,auVar151,auVar181);
    auVar75._8_4_ = 0x7fffffff;
    auVar75._0_8_ = 0x7fffffff7fffffff;
    auVar75._12_4_ = 0x7fffffff;
    auVar75._16_4_ = 0x7fffffff;
    auVar75._20_4_ = 0x7fffffff;
    auVar75._24_4_ = 0x7fffffff;
    auVar75._28_4_ = 0x7fffffff;
    auVar32 = vfmadd132ps_fma(ZEXT1632(auVar32),auVar94,auVar94);
    auVar94 = vandps_avx(auVar151,auVar75);
    auVar137._8_4_ = 0x219392ef;
    auVar137._0_8_ = 0x219392ef219392ef;
    auVar137._12_4_ = 0x219392ef;
    auVar137._16_4_ = 0x219392ef;
    auVar137._20_4_ = 0x219392ef;
    auVar137._24_4_ = 0x219392ef;
    auVar137._28_4_ = 0x219392ef;
    auVar94 = vcmpps_avx(auVar94,auVar137,2);
    auVar138._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
    auVar138._8_4_ = -auVar90._8_4_;
    auVar138._12_4_ = -auVar90._12_4_;
    auVar138._16_4_ = -auVar90._16_4_;
    auVar138._20_4_ = -auVar90._20_4_;
    auVar138._24_4_ = -auVar90._24_4_;
    auVar138._28_4_ = -auVar90._28_4_;
    auVar151 = vsubps_avx(auVar138,auVar77);
    auVar156 = vsubps_avx(auVar77,auVar90);
    auVar44._4_4_ = auVar32._4_4_ * auVar151._4_4_;
    auVar44._0_4_ = auVar32._0_4_ * auVar151._0_4_;
    auVar44._8_4_ = auVar32._8_4_ * auVar151._8_4_;
    auVar44._12_4_ = auVar32._12_4_ * auVar151._12_4_;
    auVar44._16_4_ = auVar151._16_4_ * 0.0;
    auVar44._20_4_ = auVar151._20_4_ * 0.0;
    auVar44._24_4_ = auVar151._24_4_ * 0.0;
    auVar44._28_4_ = auVar77._28_4_;
    auVar45._4_4_ = auVar32._4_4_ * auVar156._4_4_;
    auVar45._0_4_ = auVar32._0_4_ * auVar156._0_4_;
    auVar45._8_4_ = auVar32._8_4_ * auVar156._8_4_;
    auVar45._12_4_ = auVar32._12_4_ * auVar156._12_4_;
    auVar45._16_4_ = auVar156._16_4_ * 0.0;
    auVar45._20_4_ = auVar156._20_4_ * 0.0;
    auVar45._24_4_ = auVar156._24_4_ * 0.0;
    auVar45._28_4_ = auVar156._28_4_;
    auVar139._8_4_ = 0xff800000;
    auVar139._0_8_ = 0xff800000ff800000;
    auVar139._12_4_ = 0xff800000;
    auVar139._16_4_ = 0xff800000;
    auVar139._20_4_ = 0xff800000;
    auVar139._24_4_ = 0xff800000;
    auVar139._28_4_ = 0xff800000;
    auVar77 = vblendvps_avx(auVar44,auVar139,auVar94);
    auVar140._8_4_ = 0x7f800000;
    auVar140._0_8_ = 0x7f8000007f800000;
    auVar140._12_4_ = 0x7f800000;
    auVar140._16_4_ = 0x7f800000;
    auVar140._20_4_ = 0x7f800000;
    auVar140._24_4_ = 0x7f800000;
    auVar140._28_4_ = 0x7f800000;
    auVar151 = vblendvps_avx(auVar45,auVar140,auVar94);
    auVar141._0_4_ = fVar160 + fVar159 * auVar77._0_4_;
    auVar141._4_4_ = fVar168 + fVar165 * auVar77._4_4_;
    auVar141._8_4_ = fVar171 + fVar167 * auVar77._8_4_;
    auVar141._12_4_ = fVar173 + fVar169 * auVar77._12_4_;
    auVar141._16_4_ = auVar77._16_4_ * 0.0 + 0.0;
    auVar141._20_4_ = auVar77._20_4_ * 0.0 + 0.0;
    auVar141._24_4_ = auVar77._24_4_ * 0.0 + 0.0;
    auVar141._28_4_ = auVar156._28_4_ + 0.0;
    auVar101 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar94 = vcmpps_avx(auVar141,auVar101,6);
    auVar156 = vcmpps_avx(auVar141,auVar135,1);
    auVar94 = vandps_avx(auVar156,auVar94);
    auVar32 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
    auVar32 = vpand_avx(auVar2,auVar32);
    auVar94 = vpmovsxwd_avx2(auVar32);
    local_500 = vblendvps_avx(auVar140,auVar77,auVar94);
    auVar156 = vpcmpeqd_avx2(auVar123,auVar101);
    local_360._0_4_ = fVar160 + fVar159 * auVar151._0_4_;
    local_360._4_4_ = fVar168 + fVar165 * auVar151._4_4_;
    fStack_358 = fVar171 + fVar167 * auVar151._8_4_;
    fStack_354 = fVar173 + fVar169 * auVar151._12_4_;
    fStack_350 = auVar151._16_4_ * 0.0 + 0.0;
    fStack_34c = auVar151._20_4_ * 0.0 + 0.0;
    fStack_348 = auVar151._24_4_ * 0.0 + 0.0;
    register0x000012dc = auVar77._28_4_ + 0.0;
    auVar94 = vcmpps_avx(_local_360,auVar101,6);
    auVar77 = vcmpps_avx(_local_360,auVar135,1);
    auVar94 = vandps_avx(auVar77,auVar94);
    auVar32 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
    auVar32 = vpand_avx(auVar2,auVar32);
    auVar94 = vpmovsxwd_avx2(auVar32);
    local_520 = vblendvps_avx(auVar139,auVar151,auVar94);
    auVar32 = vpackssdw_avx(auVar156._0_16_,auVar156._16_16_);
    auVar94 = vrcpps_avx(ZEXT1632(auVar31));
    auVar31 = vfnmadd213ps_fma(auVar94,ZEXT1632(auVar31),auVar181);
    auVar29 = vfmadd132ps_fma(ZEXT1632(auVar31),auVar94,auVar94);
    auVar46._4_4_ = fVar165 * (float)local_480._4_4_;
    auVar46._0_4_ = fVar159 * (float)local_480._0_4_;
    auVar46._8_4_ = fVar167 * fStack_478;
    auVar46._12_4_ = fVar169 * fStack_474;
    auVar46._16_4_ = fStack_470 * 0.0;
    auVar46._20_4_ = fStack_46c * 0.0;
    auVar46._24_4_ = fStack_468 * 0.0;
    auVar46._28_4_ = auVar94._28_4_;
    auVar118._0_4_ = fVar144 * fVar160;
    auVar118._4_4_ = fVar144 * fVar168;
    auVar118._8_4_ = fVar144 * fVar171;
    auVar118._12_4_ = fVar144 * fVar173;
    auVar118._16_4_ = fVar144 * 0.0;
    auVar118._20_4_ = fVar144 * 0.0;
    auVar118._24_4_ = fVar144 * 0.0;
    auVar118._28_4_ = 0;
    auVar94 = vsubps_avx(auVar46,auVar118);
    auVar47._4_4_ = fVar165 * (float)local_4a0._4_4_;
    auVar47._0_4_ = fVar159 * (float)local_4a0._0_4_;
    auVar47._8_4_ = fVar167 * fStack_498;
    auVar47._12_4_ = fVar169 * fStack_494;
    auVar47._16_4_ = fStack_490 * 0.0;
    auVar47._20_4_ = fStack_48c * 0.0;
    auVar47._24_4_ = fStack_488 * 0.0;
    auVar47._28_4_ = 0;
    auVar48._4_4_ = fVar168 * fVar1;
    auVar48._0_4_ = fVar160 * fVar1;
    auVar48._8_4_ = fVar171 * fVar1;
    auVar48._12_4_ = fVar173 * fVar1;
    auVar48._16_4_ = fVar1 * 0.0;
    auVar48._20_4_ = fVar1 * 0.0;
    auVar48._24_4_ = fVar1 * 0.0;
    auVar48._28_4_ = auVar123._28_4_;
    auVar77 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = fVar165 * fVar18;
    auVar49._0_4_ = fVar159 * fVar16;
    auVar49._8_4_ = fVar167 * fVar20;
    auVar49._12_4_ = fVar169 * fVar22;
    auVar49._16_4_ = fVar24 * 0.0;
    auVar49._20_4_ = fVar26 * 0.0;
    auVar49._24_4_ = fVar28 * 0.0;
    auVar49._28_4_ = auVar123._28_4_;
    auVar184._0_4_ = local_2a0 * fVar160;
    auVar184._4_4_ = local_2a0 * fVar168;
    auVar184._8_4_ = local_2a0 * fVar171;
    auVar184._12_4_ = local_2a0 * fVar173;
    auVar184._16_4_ = local_2a0 * 0.0;
    auVar184._20_4_ = local_2a0 * 0.0;
    auVar184._24_4_ = local_2a0 * 0.0;
    auVar184._28_4_ = 0;
    auVar151 = vsubps_avx(auVar49,auVar184);
    auVar50._4_4_ = auVar151._4_4_ * auVar151._4_4_;
    auVar50._0_4_ = auVar151._0_4_ * auVar151._0_4_;
    auVar50._8_4_ = auVar151._8_4_ * auVar151._8_4_;
    auVar50._12_4_ = auVar151._12_4_ * auVar151._12_4_;
    auVar50._16_4_ = auVar151._16_4_ * auVar151._16_4_;
    auVar50._20_4_ = auVar151._20_4_ * auVar151._20_4_;
    auVar50._24_4_ = auVar151._24_4_ * auVar151._24_4_;
    auVar50._28_4_ = auVar151._28_4_;
    auVar31 = vfmadd231ps_fma(auVar50,auVar77,auVar77);
    auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar94,auVar94);
    auVar51._4_4_ = fVar107 * fVar107 * fVar127;
    auVar51._0_4_ = fVar99 * fVar99 * fVar122;
    auVar51._8_4_ = fVar109 * fVar109 * fVar128;
    auVar51._12_4_ = fVar111 * fVar111 * fVar130;
    auVar51._16_4_ = fVar113 * fVar113 * 0.0;
    auVar51._20_4_ = fVar115 * fVar115 * 0.0;
    auVar51._24_4_ = fVar117 * fVar117 * 0.0;
    auVar51._28_4_ = fVar194;
    auVar94 = vcmpps_avx(ZEXT1632(auVar31),auVar51,1);
    auVar178._8_4_ = 0x7f800000;
    auVar178._0_8_ = 0x7f8000007f800000;
    auVar178._12_4_ = 0x7f800000;
    auVar178._16_4_ = 0x7f800000;
    auVar178._20_4_ = 0x7f800000;
    auVar178._24_4_ = 0x7f800000;
    auVar178._28_4_ = 0x7f800000;
    auVar31 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
    auVar31 = vpand_avx(auVar32,auVar31);
    auVar52._4_4_ = auVar29._4_4_ * -fVar168;
    auVar52._0_4_ = auVar29._0_4_ * -fVar160;
    auVar52._8_4_ = auVar29._8_4_ * -fVar171;
    auVar52._12_4_ = auVar29._12_4_ * -fVar173;
    auVar52._16_4_ = 0x80000000;
    auVar52._20_4_ = 0x80000000;
    auVar52._24_4_ = 0x80000000;
    auVar52._28_4_ = 0x80000000;
    auVar31 = vpand_avx(auVar2,auVar31);
    auVar94 = vpmovsxwd_avx2(auVar31);
    local_280 = vblendvps_avx(auVar178,auVar52,auVar94);
    local_4c0._0_4_ = auVar88._0_4_;
    local_4c0._4_4_ = auVar88._4_4_;
    fStack_4b8 = auVar88._8_4_;
    fStack_4b4 = auVar88._12_4_;
    auStack_4b0._0_4_ = auVar88._16_4_;
    auStack_4b0._4_4_ = auVar88._20_4_;
    fStack_4a8 = auVar88._24_4_;
    uStack_4a4 = auVar88._28_4_;
    auVar53._4_4_ = (float)local_4c0._4_4_ * fVar17;
    auVar53._0_4_ = (float)local_4c0._0_4_ * fVar15;
    auVar53._8_4_ = fStack_4b8 * fVar19;
    auVar53._12_4_ = fStack_4b4 * fVar21;
    auVar53._16_4_ = (float)auStack_4b0._0_4_ * fVar23;
    auVar53._20_4_ = (float)auStack_4b0._4_4_ * fVar25;
    auVar53._24_4_ = fStack_4a8 * fVar27;
    auVar53._28_4_ = 0x80000000;
    auVar31 = vfmadd231ps_fma(auVar53,auVar72,local_300);
    auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar103,local_2e0);
    auVar54._4_4_ = fVar165 * auVar103._4_4_;
    auVar54._0_4_ = fVar159 * auVar103._0_4_;
    auVar54._8_4_ = fVar167 * auVar103._8_4_;
    auVar54._12_4_ = fVar169 * auVar103._12_4_;
    auVar54._16_4_ = auVar103._16_4_ * 0.0;
    auVar54._20_4_ = auVar103._20_4_ * 0.0;
    auVar54._24_4_ = auVar103._24_4_ * 0.0;
    auVar54._28_4_ = auVar103._28_4_;
    auVar55._4_4_ = fVar165 * auVar72._4_4_;
    auVar55._0_4_ = fVar159 * auVar72._0_4_;
    auVar55._8_4_ = fVar167 * auVar72._8_4_;
    auVar55._12_4_ = fVar169 * auVar72._12_4_;
    auVar55._16_4_ = auVar72._16_4_ * 0.0;
    auVar55._20_4_ = auVar72._20_4_ * 0.0;
    auVar55._24_4_ = auVar72._24_4_ * 0.0;
    auVar55._28_4_ = auVar72._28_4_;
    auVar56._4_4_ = fVar165 * (float)local_4c0._4_4_;
    auVar56._0_4_ = fVar159 * (float)local_4c0._0_4_;
    auVar56._8_4_ = fVar167 * fStack_4b8;
    auVar56._12_4_ = fVar169 * fStack_4b4;
    auVar56._16_4_ = (float)auStack_4b0._0_4_ * 0.0;
    auVar56._20_4_ = (float)auStack_4b0._4_4_ * 0.0;
    auVar56._24_4_ = fStack_4a8 * 0.0;
    auVar56._28_4_ = uStack_4a4;
    fVar160 = auVar31._0_4_;
    auVar163._0_4_ = fVar144 * fVar160;
    fVar168 = auVar31._4_4_;
    auVar163._4_4_ = fVar144 * fVar168;
    fVar171 = auVar31._8_4_;
    auVar163._8_4_ = fVar144 * fVar171;
    fVar173 = auVar31._12_4_;
    auVar163._12_4_ = fVar144 * fVar173;
    auVar163._16_4_ = fVar144 * 0.0;
    auVar163._20_4_ = fVar144 * 0.0;
    auVar163._24_4_ = fVar144 * 0.0;
    auVar163._28_4_ = 0;
    auVar94 = vsubps_avx(auVar54,auVar163);
    auVar57._4_4_ = fVar1 * fVar168;
    auVar57._0_4_ = fVar1 * fVar160;
    auVar57._8_4_ = fVar1 * fVar171;
    auVar57._12_4_ = fVar1 * fVar173;
    auVar57._16_4_ = fVar1 * 0.0;
    auVar57._20_4_ = fVar1 * 0.0;
    auVar57._24_4_ = fVar1 * 0.0;
    auVar57._28_4_ = 0;
    auVar77 = vsubps_avx(auVar55,auVar57);
    auVar58._4_4_ = local_2a0 * fVar168;
    auVar58._0_4_ = local_2a0 * fVar160;
    auVar58._8_4_ = local_2a0 * fVar171;
    auVar58._12_4_ = local_2a0 * fVar173;
    auVar58._16_4_ = local_2a0 * 0.0;
    auVar58._20_4_ = local_2a0 * 0.0;
    auVar58._24_4_ = local_2a0 * 0.0;
    auVar58._28_4_ = 0;
    auVar151 = vsubps_avx(auVar56,auVar58);
    auVar59._4_4_ = auVar151._4_4_ * auVar151._4_4_;
    auVar59._0_4_ = auVar151._0_4_ * auVar151._0_4_;
    auVar59._8_4_ = auVar151._8_4_ * auVar151._8_4_;
    auVar59._12_4_ = auVar151._12_4_ * auVar151._12_4_;
    auVar59._16_4_ = auVar151._16_4_ * auVar151._16_4_;
    auVar59._20_4_ = auVar151._20_4_ * auVar151._20_4_;
    auVar59._24_4_ = auVar151._24_4_ * auVar151._24_4_;
    auVar59._28_4_ = auVar151._28_4_;
    auVar31 = vfmadd231ps_fma(auVar59,auVar77,auVar77);
    auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar94,auVar94);
    local_540._0_4_ = auVar100._0_4_;
    local_540._4_4_ = auVar100._4_4_;
    fStack_538 = auVar100._8_4_;
    fStack_534 = auVar100._12_4_;
    fStack_530 = auVar100._16_4_;
    fStack_52c = auVar100._20_4_;
    fStack_528 = auVar100._24_4_;
    auVar60._4_4_ = (float)local_540._4_4_ * (float)local_540._4_4_ * fVar127;
    auVar60._0_4_ = (float)local_540._0_4_ * (float)local_540._0_4_ * fVar122;
    auVar60._8_4_ = fStack_538 * fStack_538 * fVar128;
    auVar60._12_4_ = fStack_534 * fStack_534 * fVar130;
    auVar60._16_4_ = fStack_530 * fStack_530 * 0.0;
    auVar60._20_4_ = fStack_52c * fStack_52c * 0.0;
    auVar60._24_4_ = fStack_528 * fStack_528 * 0.0;
    auVar60._28_4_ = auVar77._28_4_;
    uVar97 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar76._4_4_ = uVar97;
    auVar76._0_4_ = uVar97;
    auVar76._8_4_ = uVar97;
    auVar76._12_4_ = uVar97;
    auVar76._16_4_ = uVar97;
    auVar76._20_4_ = uVar97;
    auVar76._24_4_ = uVar97;
    auVar76._28_4_ = uVar97;
    auVar94 = vcmpps_avx(ZEXT1632(auVar31),auVar60,1);
    auVar31 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
    auVar30 = vpand_avx(auVar31,auVar30);
    auVar91._0_4_ = auVar29._0_4_ * -fVar160;
    auVar91._4_4_ = auVar29._4_4_ * -fVar168;
    auVar91._8_4_ = auVar29._8_4_ * -fVar171;
    auVar91._12_4_ = auVar29._12_4_ * -fVar173;
    auVar91._16_4_ = 0x80000000;
    auVar91._20_4_ = 0x80000000;
    auVar91._24_4_ = 0x80000000;
    auVar91._28_4_ = 0;
    auVar30 = vpand_avx(auVar2,auVar30);
    auVar94 = vpmovsxwd_avx2(auVar30);
    auVar94 = vblendvps_avx(auVar178,auVar91,auVar94);
    auVar156 = vminps_avx(local_280,auVar94);
    auVar77 = vmaxps_avx(local_280,auVar94);
    auVar72 = vminps_avx(local_500,auVar156);
    auVar151 = vcmpps_avx(auVar72,auVar156,0);
    auVar94 = vcmpps_avx(auVar178,auVar77,0);
    auVar148._8_4_ = 0xff800000;
    auVar148._0_8_ = 0xff800000ff800000;
    auVar148._12_4_ = 0xff800000;
    auVar148._16_4_ = 0xff800000;
    auVar148._20_4_ = 0xff800000;
    auVar148._24_4_ = 0xff800000;
    auVar148._28_4_ = 0xff800000;
    auVar94 = vblendvps_avx(auVar77,auVar148,auVar94);
    auVar77 = vcmpps_avx(auVar178,auVar156,0);
    auVar77 = vblendvps_avx(auVar156,auVar148,auVar77);
    auVar94 = vblendvps_avx(auVar77,auVar94,auVar151);
    local_80 = vmaxps_avx(local_520,auVar94);
    auVar102._0_4_ = local_340 + auVar72._0_4_;
    auVar102._4_4_ = fStack_33c + auVar72._4_4_;
    auVar102._8_4_ = fStack_338 + auVar72._8_4_;
    auVar102._12_4_ = fStack_334 + auVar72._12_4_;
    auVar102._16_4_ = auVar72._16_4_ + 0.0;
    auVar102._20_4_ = auVar72._20_4_ + 0.0;
    auVar102._24_4_ = auVar72._24_4_ + 0.0;
    auVar102._28_4_ = fStack_324 + auVar72._28_4_;
    fVar160 = (ray->super_RayK<1>).tfar;
    auVar119._4_4_ = fVar160;
    auVar119._0_4_ = fVar160;
    auVar119._8_4_ = fVar160;
    auVar119._12_4_ = fVar160;
    auVar119._16_4_ = fVar160;
    auVar119._20_4_ = fVar160;
    auVar119._24_4_ = fVar160;
    auVar119._28_4_ = fVar160;
    auVar94 = vcmpps_avx(auVar76,auVar102,2);
    auVar77 = vcmpps_avx(auVar102,auVar119,2);
    auVar94 = vandps_avx(auVar94,auVar77);
    auVar77 = vcmpps_avx(auVar178,auVar72,4);
    auVar94 = vandps_avx(auVar94,auVar77);
    auVar30 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
    _local_4c0 = vpand_avx(auVar2,auVar30);
    local_540._0_4_ = local_340 + local_80._0_4_;
    local_540._4_4_ = fStack_33c + local_80._4_4_;
    fStack_538 = fStack_338 + local_80._8_4_;
    fStack_534 = fStack_334 + local_80._12_4_;
    fStack_530 = local_80._16_4_ + 0.0;
    fStack_52c = local_80._20_4_ + 0.0;
    fStack_528 = local_80._24_4_ + 0.0;
    fStack_a4 = local_80._28_4_;
    register0x0000129c = fStack_324 + fStack_a4;
    auVar94 = vcmpps_avx(auVar76,_local_540,2);
    auVar77 = vcmpps_avx(_local_540,auVar119,2);
    auVar94 = vandps_avx(auVar94,auVar77);
    auVar77 = vcmpps_avx(auVar148,local_80,4);
    auVar94 = vandps_avx(auVar94,auVar77);
    auVar30 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
    local_240 = vpand_avx(auVar2,auVar30);
    auVar30 = vpor_avx(_local_4c0,local_240);
    auVar94 = vpmovsxwd_avx2(auVar30);
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar94 >> 0x7f,0) != '\0') ||
          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar94 >> 0xbf,0) != '\0') ||
        (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar94[0x1f] < '\0')
    {
      auStack_230 = auVar103._16_16_;
      _auStack_4b0 = auVar88._16_16_;
      local_260 = auVar94;
      auVar77 = vpmovzxwd_avx2(_local_4c0);
      auVar103 = vpslld_avx2(auVar77,0x1f);
      auVar77 = vblendvps_avx(local_80,auVar72,auVar103);
      auVar151 = vblendvps_avx(_local_360,auVar141,auVar103);
      auVar88 = vrcpps_avx(auVar135);
      auVar182._8_4_ = 0x3f800000;
      auVar182._0_8_ = &DAT_3f8000003f800000;
      auVar182._12_4_ = 0x3f800000;
      auVar182._16_4_ = 0x3f800000;
      auVar182._20_4_ = 0x3f800000;
      auVar182._24_4_ = 0x3f800000;
      auVar182._28_4_ = 0x3f800000;
      auVar32 = vfnmadd213ps_fma(auVar88,auVar135,auVar182);
      fVar99 = fVar129 * fVar134 * fVar99;
      fVar107 = fVar131 * fVar166 * fVar107;
      fVar109 = fVar132 * fVar170 * fVar109;
      fVar111 = fVar133 * fVar172 * fVar111;
      fVar113 = fVar187 * 0.0 * fVar113;
      fVar115 = fVar190 * 0.0 * fVar115;
      fVar117 = fVar192 * 0.0 * fVar117;
      local_a0 = local_2e0._0_4_ * fVar99;
      fStack_9c = local_2e0._4_4_ * fVar107;
      fVar129 = local_2e0._8_4_;
      fVar131 = local_2e0._12_4_;
      fVar132 = local_2e0._16_4_;
      fVar133 = local_2e0._20_4_;
      fVar134 = local_2e0._24_4_;
      local_c0 = fVar71 * local_2e0._0_4_;
      fStack_bc = fVar81 * local_2e0._4_4_;
      auVar156 = vcmpps_avx(auVar77,local_500,0);
      auVar72 = vcmpps_avx(auVar77,local_520,0);
      auVar156 = vorps_avx(auVar156,auVar72);
      auVar31 = vpackssdw_avx(auVar156._0_16_,auVar156._16_16_);
      auVar31 = vpand_avx(auVar2,auVar31);
      auVar72 = vpmovsxwd_avx2(auVar31);
      auVar156 = vcmpps_avx(auVar77,local_280,0);
      auVar31 = vpackssdw_avx(auVar156._0_16_,auVar156._16_16_);
      auVar2 = vpand_avx(auVar2,auVar31);
      auVar100 = vpmovsxwd_avx2(auVar2);
      fVar160 = auVar77._0_4_;
      fVar166 = auVar77._4_4_;
      fVar168 = auVar77._8_4_;
      fVar170 = auVar77._12_4_;
      fVar171 = auVar77._16_4_;
      fVar172 = auVar77._20_4_;
      fVar173 = auVar77._24_4_;
      fStack_98 = fVar129 * fVar109;
      fStack_94 = fVar131 * fVar111;
      fStack_90 = fVar132 * fVar113;
      fStack_8c = fVar133 * fVar115;
      fStack_88 = fVar134 * fVar117;
      auVar120._0_4_ = local_a0 + fVar186 * (fVar160 * fVar144 + (float)local_480._0_4_);
      auVar120._4_4_ = fStack_9c + fVar189 * (fVar166 * fVar144 + (float)local_480._4_4_);
      auVar120._8_4_ = fVar129 * fVar109 + fVar191 * (fVar168 * fVar144 + fStack_478);
      auVar120._12_4_ = fVar131 * fVar111 + fVar193 * (fVar170 * fVar144 + fStack_474);
      auVar120._16_4_ = fVar132 * fVar113 + (fVar171 * fVar144 + fStack_470) * 0.0;
      auVar120._20_4_ = fVar133 * fVar115 + (fVar172 * fVar144 + fStack_46c) * 0.0;
      auVar120._24_4_ = fVar134 * fVar117 + (fVar173 * fVar144 + fStack_468) * 0.0;
      auVar120._28_4_ = fStack_84 + local_480._28_4_ + 0.0;
      fStack_b8 = fVar82 * fVar129;
      fStack_b4 = fVar83 * fVar131;
      fStack_b0 = fVar84 * fVar132;
      fStack_ac = fVar85 * fVar133;
      fStack_a8 = fVar86 * fVar134;
      fVar187 = auVar151._0_4_;
      fVar190 = auVar151._4_4_;
      auVar61._4_4_ = fVar190 * fStack_bc;
      auVar61._0_4_ = fVar187 * local_c0;
      fVar192 = auVar151._8_4_;
      auVar61._8_4_ = fVar192 * fVar82 * fVar129;
      fVar194 = auVar151._12_4_;
      auVar61._12_4_ = fVar194 * fVar83 * fVar131;
      fVar87 = auVar151._16_4_;
      auVar61._16_4_ = fVar87 * fVar84 * fVar132;
      fVar96 = auVar151._20_4_;
      auVar61._20_4_ = fVar96 * fVar85 * fVar133;
      fVar98 = auVar151._24_4_;
      auVar61._24_4_ = fVar98 * fVar86 * fVar134;
      auVar61._28_4_ = fStack_84;
      auVar156 = vsubps_avx(auVar120,auVar61);
      local_120._0_8_ = local_2e0._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar129;
      local_120._12_4_ = -fVar131;
      local_120._16_4_ = -fVar132;
      local_120._20_4_ = -fVar133;
      local_120._24_4_ = -fVar134;
      local_120._28_4_ = local_2e0._28_4_ ^ 0x80000000;
      auVar151 = vblendvps_avx(local_2e0,local_120,auVar100);
      local_220 = vblendvps_avx(auVar151,auVar156,auVar72);
      auVar2 = vfmadd132ps_fma(ZEXT1632(auVar32),auVar88,auVar88);
      auVar143 = ZEXT3264(local_300);
      local_100 = local_300._0_4_ * fVar99;
      fStack_fc = local_300._4_4_ * fVar107;
      fVar129 = local_300._8_4_;
      fVar131 = local_300._12_4_;
      fVar132 = local_300._16_4_;
      fVar144 = local_300._20_4_;
      fStack_e4 = auVar88._28_4_;
      fVar133 = local_300._24_4_;
      fStack_f8 = fVar129 * fVar109;
      fStack_f4 = fVar131 * fVar111;
      fStack_f0 = fVar132 * fVar113;
      fStack_ec = fVar144 * fVar115;
      fStack_e8 = fVar133 * fVar117;
      auVar149._0_4_ = local_100 + fVar186 * (fVar160 * fVar1 + (float)local_4a0._0_4_);
      auVar149._4_4_ = fStack_fc + fVar189 * (fVar166 * fVar1 + (float)local_4a0._4_4_);
      auVar149._8_4_ = fVar129 * fVar109 + fVar191 * (fVar168 * fVar1 + fStack_498);
      auVar149._12_4_ = fVar131 * fVar111 + fVar193 * (fVar170 * fVar1 + fStack_494);
      auVar149._16_4_ = fVar132 * fVar113 + (fVar171 * fVar1 + fStack_490) * 0.0;
      auVar149._20_4_ = fVar144 * fVar115 + (fVar172 * fVar1 + fStack_48c) * 0.0;
      auVar149._24_4_ = fVar133 * fVar117 + (fVar173 * fVar1 + fStack_488) * 0.0;
      auVar149._28_4_ = fStack_e4 + fStack_a4;
      local_e0 = fVar71 * local_300._0_4_;
      fStack_dc = fVar81 * local_300._4_4_;
      fStack_d8 = fVar82 * fVar129;
      fStack_d4 = fVar83 * fVar131;
      fStack_d0 = fVar84 * fVar132;
      fStack_cc = fVar85 * fVar144;
      fStack_c8 = fVar86 * fVar133;
      fStack_c4 = fStack_e4;
      auVar155._0_4_ = fVar187 * local_e0;
      auVar155._4_4_ = fVar190 * fStack_dc;
      auVar155._8_4_ = fVar192 * fVar82 * fVar129;
      auVar155._12_4_ = fVar194 * fVar83 * fVar131;
      auVar155._16_4_ = fVar87 * fVar84 * fVar132;
      auVar155._20_4_ = fVar96 * fVar85 * fVar144;
      auVar155._24_4_ = fVar98 * fVar86 * fVar133;
      auVar155._28_4_ = 0;
      auVar156 = vsubps_avx(auVar149,auVar155);
      local_180._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
      local_180._8_4_ = -fVar129;
      local_180._12_4_ = -fVar131;
      local_180._16_4_ = -fVar132;
      local_180._20_4_ = -fVar144;
      local_180._24_4_ = -fVar133;
      local_180._28_4_ = -fVar36;
      auVar151 = vblendvps_avx(local_300,local_180,auVar100);
      local_3a0 = vblendvps_avx(auVar151,auVar156,auVar72);
      auVar183 = ZEXT3264(local_320);
      local_140 = fVar15 * fVar99;
      fStack_13c = fVar17 * fVar107;
      fStack_138 = fVar19 * fVar109;
      fStack_134 = fVar21 * fVar111;
      fStack_130 = fVar23 * fVar113;
      fStack_12c = fVar25 * fVar115;
      fStack_128 = fVar27 * fVar117;
      fStack_124 = auVar151._28_4_;
      auVar104._0_4_ = fVar15 * fVar99 + fVar186 * (fVar16 + local_2a0 * fVar160);
      auVar104._4_4_ = fVar17 * fVar107 + fVar189 * (fVar18 + local_2a0 * fVar166);
      auVar104._8_4_ = fVar19 * fVar109 + fVar191 * (fVar20 + local_2a0 * fVar168);
      auVar104._12_4_ = fVar21 * fVar111 + fVar193 * (fVar22 + local_2a0 * fVar170);
      auVar104._16_4_ = fVar23 * fVar113 + (fVar24 + local_2a0 * fVar171) * 0.0;
      auVar104._20_4_ = fVar25 * fVar115 + (fVar26 + local_2a0 * fVar172) * 0.0;
      auVar104._24_4_ = fVar27 * fVar117 + (fVar28 + local_2a0 * fVar173) * 0.0;
      auVar104._28_4_ = auVar151._28_4_ + local_2c0._28_4_ + auVar103._28_4_;
      local_1a0._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
      local_1a0._8_4_ = -fVar19;
      local_1a0._12_4_ = -fVar21;
      local_1a0._16_4_ = -fVar23;
      local_1a0._20_4_ = -fVar25;
      local_1a0._24_4_ = -fVar27;
      local_1a0._28_4_ = local_320._28_4_ ^ 0x80000000;
      local_200 = fVar15 * fVar71;
      fStack_1fc = fVar17 * fVar81;
      fStack_1f8 = fVar19 * fVar82;
      fStack_1f4 = fVar21 * fVar83;
      fStack_1f0 = fVar23 * fVar84;
      fStack_1ec = fVar25 * fVar85;
      fStack_1e8 = fVar27 * fVar86;
      uStack_1e4 = auVar156._28_4_;
      auVar62._4_4_ = fVar190 * fVar17 * fVar81;
      auVar62._0_4_ = fVar187 * fVar15 * fVar71;
      auVar62._8_4_ = fVar192 * fVar19 * fVar82;
      auVar62._12_4_ = fVar194 * fVar21 * fVar83;
      auVar62._16_4_ = fVar87 * fVar23 * fVar84;
      auVar62._20_4_ = fVar96 * fVar25 * fVar85;
      auVar62._24_4_ = fVar98 * fVar27 * fVar86;
      auVar62._28_4_ = auVar156._28_4_;
      auVar151 = vblendvps_avx(local_320,local_1a0,auVar100);
      auVar156 = vsubps_avx(auVar104,auVar62);
      local_380 = vblendvps_avx(auVar151,auVar156,auVar72);
      auVar150._8_4_ = 0x3f800000;
      auVar150._0_8_ = &DAT_3f8000003f800000;
      auVar150._12_4_ = 0x3f800000;
      auVar150._16_4_ = 0x3f800000;
      auVar150._20_4_ = 0x3f800000;
      auVar150._24_4_ = 0x3f800000;
      auVar150._28_4_ = 0x3f800000;
      local_160 = vandnps_avx(auVar100,auVar150);
      _local_4e0 = ZEXT1632(auVar2);
      auVar63._4_4_ = fVar190 * auVar2._4_4_;
      auVar63._0_4_ = fVar187 * auVar2._0_4_;
      auVar63._8_4_ = fVar192 * auVar2._8_4_;
      auVar63._12_4_ = fVar194 * auVar2._12_4_;
      auVar63._16_4_ = fVar87 * 0.0;
      auVar63._20_4_ = fVar96 * 0.0;
      auVar63._24_4_ = fVar98 * 0.0;
      auVar63._28_4_ = auVar100._28_4_;
      local_420 = vblendvps_avx(local_160,auVar63,auVar72);
      local_3e0._0_4_ = fVar160 + local_340;
      local_3e0._4_4_ = fVar166 + fStack_33c;
      local_3e0._8_4_ = fVar168 + fStack_338;
      local_3e0._12_4_ = fVar170 + fStack_334;
      local_3e0._16_4_ = fVar171 + 0.0;
      local_3e0._20_4_ = fVar172 + 0.0;
      local_3e0._24_4_ = fVar173 + 0.0;
      local_3e0._28_4_ = auVar77._28_4_ + fStack_324;
      local_400 = ZEXT832(0) << 0x20;
      local_3c0 = local_220;
      auVar77 = vpmovzxwd_avx2(auVar30);
      auVar77 = vpslld_avx2(auVar77,0x1f);
      auVar92._8_4_ = 0x7f800000;
      auVar92._0_8_ = 0x7f8000007f800000;
      auVar92._12_4_ = 0x7f800000;
      auVar92._16_4_ = 0x7f800000;
      auVar92._20_4_ = 0x7f800000;
      auVar92._24_4_ = 0x7f800000;
      auVar92._28_4_ = 0x7f800000;
      local_560 = local_3e0;
      auVar77 = vblendvps_avx(auVar92,local_3e0,auVar77);
      auVar151 = vshufps_avx(auVar77,auVar77,0xb1);
      auVar151 = vminps_avx(auVar77,auVar151);
      auVar156 = vshufpd_avx(auVar151,auVar151,5);
      auVar151 = vminps_avx(auVar151,auVar156);
      auVar156 = vpermpd_avx2(auVar151,0x4e);
      auVar151 = vminps_avx(auVar151,auVar156);
      auVar77 = vcmpps_avx(auVar77,auVar151,0);
      local_5a0 = auVar94;
      auVar151 = auVar94 & auVar77;
      auVar158 = ZEXT3264(CONCAT428(local_2a0,
                                    CONCAT424(local_2a0,
                                              CONCAT420(local_2a0,
                                                        CONCAT416(local_2a0,
                                                                  CONCAT412(local_2a0,
                                                                            CONCAT48(local_2a0,
                                                                                     CONCAT44(
                                                  local_2a0,local_2a0))))))));
      auVar153 = ZEXT3264(local_440);
      auVar164 = ZEXT3264(local_460);
      auVar177 = ZEXT3264(_local_480);
      auVar180 = ZEXT3264(_local_4a0);
      auVar185 = ZEXT3264(local_2c0);
      auVar136 = ZEXT3264(local_2e0);
      auVar188 = ZEXT3264(local_520);
      if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar151 >> 0x7f,0) != '\0') ||
            (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar151 >> 0xbf,0) != '\0') ||
          (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar151[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar77,auVar94);
      }
      uVar68 = vmovmskps_avx(auVar94);
      uVar69 = 0;
      for (; _local_4a0 = auVar176, _local_480 = auVar179, (uVar68 & 1) == 0;
          uVar68 = uVar68 >> 1 | 0x80000000) {
        uVar69 = uVar69 + 1;
      }
LAB_017fb2f4:
      auVar156 = auVar158._0_32_;
      auVar151 = auVar153._0_32_;
      auVar88 = auVar185._0_32_;
      auVar179 = auVar180._0_32_;
      auVar176 = auVar177._0_32_;
      auVar161 = auVar164._0_28_;
      auVar100 = auVar188._0_32_;
      auVar72 = auVar183._0_32_;
      auVar77 = auVar143._0_32_;
      auVar94 = auVar136._0_32_;
      uVar70 = (ulong)uVar69;
      local_5b8 = local_1c0[uVar70];
      pGVar12 = (pSVar11->geometries).items[local_5b8].ptr;
      if ((pGVar12->mask & (ray->super_RayK<1>).mask) == 0) {
        *(undefined4 *)(local_5a0 + uVar70 * 4) = 0;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          fVar129 = *(float *)(local_420 + uVar70 * 4);
          fVar131 = *(float *)(local_400 + uVar70 * 4);
          (ray->super_RayK<1>).tfar = *(float *)(local_3e0 + uVar70 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_3c0 + uVar70 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_3a0 + uVar70 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_380 + uVar70 * 4);
          ray->u = fVar129;
          ray->v = fVar131;
          ray->primID = (line->primIDs).field_0.i[uVar70];
          ray->geomID = local_5b8;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
LAB_017fb6a9:
          fVar129 = (ray->super_RayK<1>).tfar;
          auVar79._4_4_ = fVar129;
          auVar79._0_4_ = fVar129;
          auVar79._8_4_ = fVar129;
          auVar79._12_4_ = fVar129;
          auVar79._16_4_ = fVar129;
          auVar79._20_4_ = fVar129;
          auVar79._24_4_ = fVar129;
          auVar79._28_4_ = fVar129;
          auVar30 = vpand_avx(local_240,_local_4c0);
          auVar103 = vcmpps_avx(_local_540,auVar79,2);
          auVar2 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
          auVar2 = vpand_avx(auVar2,auVar30);
          auVar103 = vpmovzxwd_avx2(auVar2);
          auVar103 = vpslld_avx2(auVar103,0x1f);
          if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar103 >> 0x7f,0) == '\0') &&
                (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0xbf,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar103[0x1f]) {
            return;
          }
          auVar123 = vcmpps_avx(local_80,local_280,0);
          auVar94 = vblendvps_avx(auVar94,local_120,auVar123);
          auVar77 = vblendvps_avx(auVar77,local_180,auVar123);
          auVar72 = vblendvps_avx(auVar72,local_1a0,auVar123);
          auVar123 = vcmpps_avx(local_80,local_500,0);
          auVar100 = vcmpps_avx(local_80,auVar100,0);
          auVar123 = vorps_avx(auVar123,auVar100);
          fVar129 = local_80._0_4_;
          fVar131 = local_80._4_4_;
          fVar1 = local_80._8_4_;
          fVar132 = local_80._12_4_;
          fVar144 = local_80._16_4_;
          fVar133 = local_80._20_4_;
          fVar15 = local_80._24_4_;
          auVar142._0_4_ =
               (float)local_1e0._0_4_ * (auVar176._0_4_ + auVar161._0_4_ * fVar129) + local_a0;
          auVar142._4_4_ =
               (float)local_1e0._4_4_ * (auVar176._4_4_ + auVar161._4_4_ * fVar131) + fStack_9c;
          auVar142._8_4_ = fStack_1d8 * (auVar176._8_4_ + auVar161._8_4_ * fVar1) + fStack_98;
          auVar142._12_4_ = fStack_1d4 * (auVar176._12_4_ + auVar161._12_4_ * fVar132) + fStack_94;
          auVar142._16_4_ = fStack_1d0 * (auVar176._16_4_ + auVar161._16_4_ * fVar144) + fStack_90;
          auVar142._20_4_ = fStack_1cc * (auVar176._20_4_ + auVar161._20_4_ * fVar133) + fStack_8c;
          auVar142._24_4_ = fStack_1c8 * (auVar176._24_4_ + auVar161._24_4_ * fVar15) + fStack_88;
          auVar142._28_4_ = auVar176._28_4_ + auVar100._28_4_ + fStack_84;
          auVar152._0_4_ =
               (float)local_1e0._0_4_ * (auVar179._0_4_ + fVar129 * auVar151._0_4_) + local_100;
          auVar152._4_4_ =
               (float)local_1e0._4_4_ * (auVar179._4_4_ + fVar131 * auVar151._4_4_) + fStack_fc;
          auVar152._8_4_ = fStack_1d8 * (auVar179._8_4_ + fVar1 * auVar151._8_4_) + fStack_f8;
          auVar152._12_4_ = fStack_1d4 * (auVar179._12_4_ + fVar132 * auVar151._12_4_) + fStack_f4;
          auVar152._16_4_ = fStack_1d0 * (auVar179._16_4_ + fVar144 * auVar151._16_4_) + fStack_f0;
          auVar152._20_4_ = fStack_1cc * (auVar179._20_4_ + fVar133 * auVar151._20_4_) + fStack_ec;
          auVar152._24_4_ = fStack_1c8 * (auVar179._24_4_ + fVar15 * auVar151._24_4_) + fStack_e8;
          auVar152._28_4_ = auVar179._28_4_ + auVar151._28_4_ + fStack_e4;
          auVar157._0_4_ =
               (float)local_1e0._0_4_ * (auVar88._0_4_ + auVar156._0_4_ * fVar129) + local_140;
          auVar157._4_4_ =
               (float)local_1e0._4_4_ * (auVar88._4_4_ + auVar156._4_4_ * fVar131) + fStack_13c;
          auVar157._8_4_ = fStack_1d8 * (auVar88._8_4_ + auVar156._8_4_ * fVar1) + fStack_138;
          auVar157._12_4_ = fStack_1d4 * (auVar88._12_4_ + auVar156._12_4_ * fVar132) + fStack_134;
          auVar157._16_4_ = fStack_1d0 * (auVar88._16_4_ + auVar156._16_4_ * fVar144) + fStack_130;
          auVar157._20_4_ = fStack_1cc * (auVar88._20_4_ + auVar156._20_4_ * fVar133) + fStack_12c;
          auVar157._24_4_ = fStack_1c8 * (auVar88._24_4_ + auVar156._24_4_ * fVar15) + fStack_128;
          auVar157._28_4_ = auVar88._28_4_ + auVar156._28_4_ + fStack_124;
          auVar64._4_4_ = (float)local_360._4_4_ * fStack_bc;
          auVar64._0_4_ = (float)local_360._0_4_ * local_c0;
          auVar64._8_4_ = fStack_358 * fStack_b8;
          auVar64._12_4_ = fStack_354 * fStack_b4;
          auVar64._16_4_ = fStack_350 * fStack_b0;
          auVar64._20_4_ = fStack_34c * fStack_ac;
          auVar64._24_4_ = fStack_348 * fStack_a8;
          auVar64._28_4_ = uStack_1c4;
          auVar151 = vsubps_avx(auVar142,auVar64);
          auVar65._4_4_ = (float)local_360._4_4_ * fStack_dc;
          auVar65._0_4_ = (float)local_360._0_4_ * local_e0;
          auVar65._8_4_ = fStack_358 * fStack_d8;
          auVar65._12_4_ = fStack_354 * fStack_d4;
          auVar65._16_4_ = fStack_350 * fStack_d0;
          auVar65._20_4_ = fStack_34c * fStack_cc;
          auVar65._24_4_ = fStack_348 * fStack_c8;
          auVar65._28_4_ = uStack_1c4;
          auVar156 = vsubps_avx(auVar152,auVar65);
          auVar66._4_4_ = (float)local_360._4_4_ * fStack_1fc;
          auVar66._0_4_ = (float)local_360._0_4_ * local_200;
          auVar66._8_4_ = fStack_358 * fStack_1f8;
          auVar66._12_4_ = fStack_354 * fStack_1f4;
          auVar66._16_4_ = fStack_350 * fStack_1f0;
          auVar66._20_4_ = fStack_34c * fStack_1ec;
          auVar66._24_4_ = fStack_348 * fStack_1e8;
          auVar66._28_4_ = uStack_1c4;
          auVar176 = vsubps_avx(auVar157,auVar66);
          local_3c0 = vblendvps_avx(auVar94,auVar151,auVar123);
          local_3a0 = vblendvps_avx(auVar77,auVar156,auVar123);
          local_380 = vblendvps_avx(auVar72,auVar176,auVar123);
          auVar67._4_4_ = (float)local_360._4_4_ * (float)local_4e0._4_4_;
          auVar67._0_4_ = (float)local_360._0_4_ * (float)local_4e0._0_4_;
          auVar67._8_4_ = fStack_358 * fStack_4d8;
          auVar67._12_4_ = fStack_354 * fStack_4d4;
          auVar67._16_4_ = fStack_350 * fStack_4d0;
          auVar67._20_4_ = fStack_34c * fStack_4cc;
          auVar67._24_4_ = fStack_348 * fStack_4c8;
          auVar67._28_4_ = auVar151._28_4_;
          local_420 = vblendvps_avx(local_160,auVar67,auVar123);
          local_400 = ZEXT832(0) << 0x20;
          local_3e0 = _local_540;
          auVar105._8_4_ = 0x7f800000;
          auVar105._0_8_ = 0x7f8000007f800000;
          auVar105._12_4_ = 0x7f800000;
          auVar105._16_4_ = 0x7f800000;
          auVar105._20_4_ = 0x7f800000;
          auVar105._24_4_ = 0x7f800000;
          auVar105._28_4_ = 0x7f800000;
          auVar94 = vblendvps_avx(auVar105,_local_540,auVar103);
          auVar77 = vshufps_avx(auVar94,auVar94,0xb1);
          auVar77 = vminps_avx(auVar94,auVar77);
          auVar151 = vshufpd_avx(auVar77,auVar77,5);
          auVar77 = vminps_avx(auVar77,auVar151);
          auVar151 = vpermpd_avx2(auVar77,0x4e);
          auVar77 = vminps_avx(auVar77,auVar151);
          auVar94 = vcmpps_avx(auVar94,auVar77,0);
          auVar30 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
          auVar2 = vpand_avx(auVar30,auVar2);
          local_5a0 = vpsrad_avx2(auVar103,0x1f);
          pSVar11 = context->scene;
          auVar94 = vpmovzxwd_avx2(auVar2);
          auVar94 = vpslld_avx2(auVar94,0x1f);
          if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar94 >> 0x7f,0) == '\0') &&
                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar94 >> 0xbf,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar94[0x1f]) {
            auVar94 = local_5a0;
          }
          uVar68 = vmovmskps_avx(auVar94);
          uVar69 = 0;
          for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
            uVar69 = uVar69 + 1;
          }
          do {
            uVar70 = (ulong)uVar69;
            local_5b8 = local_1c0[uVar70];
            pGVar12 = (pSVar11->geometries).items[local_5b8].ptr;
            if ((pGVar12->mask & (ray->super_RayK<1>).mask) == 0) {
              *(undefined4 *)(local_5a0 + uVar70 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar129 = *(float *)(local_420 + uVar70 * 4);
                fVar131 = *(float *)(local_400 + uVar70 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_3e0 + uVar70 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_3c0 + uVar70 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_3a0 + uVar70 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_380 + uVar70 * 4);
                ray->u = fVar129;
                ray->v = fVar131;
                ray->primID = (line->primIDs).field_0.i[uVar70];
                ray->geomID = local_5b8;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_5d0 = *(float *)(local_3c0 + uVar70 * 4);
              local_5cc = *(undefined4 *)(local_3a0 + uVar70 * 4);
              local_5c8 = *(undefined4 *)(local_380 + uVar70 * 4);
              local_5c4 = *(undefined4 *)(local_420 + uVar70 * 4);
              local_5c0 = *(undefined4 *)(local_400 + uVar70 * 4);
              local_5bc = (line->primIDs).field_0.i[uVar70];
              local_5b4 = context->user->instID[0];
              local_5b0 = context->user->instPrimID[0];
              local_560._0_4_ = (ray->super_RayK<1>).tfar;
              (ray->super_RayK<1>).tfar = *(float *)(local_3e0 + uVar70 * 4);
              local_60c = -1;
              local_600.valid = &local_60c;
              local_600.geometryUserPtr = pGVar12->userPtr;
              local_600.context = context->user;
              local_600.ray = (RTCRayN *)ray;
              local_600.hit = (RTCHitN *)&local_5d0;
              local_600.N = 1;
              if ((pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar12->intersectionFilterN)(&local_600), context = local_608,
                 *local_600.valid != 0)) {
                p_Var14 = context->args->filter;
                if (p_Var14 != (RTCFilterFunctionN)0x0) {
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                    (*p_Var14)(&local_600);
                    context = local_608;
                  }
                  if (*local_600.valid == 0) goto LAB_017fbac6;
                }
                (((Vec3f *)((long)local_600.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_600.hit;
                (((Vec3f *)((long)local_600.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_600.hit + 4);
                (((Vec3f *)((long)local_600.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_600.hit + 8);
                *(float *)((long)local_600.ray + 0x3c) = *(float *)(local_600.hit + 0xc);
                *(float *)((long)local_600.ray + 0x40) = *(float *)(local_600.hit + 0x10);
                *(float *)((long)local_600.ray + 0x44) = *(float *)(local_600.hit + 0x14);
                *(float *)((long)local_600.ray + 0x48) = *(float *)(local_600.hit + 0x18);
                *(float *)((long)local_600.ray + 0x4c) = *(float *)(local_600.hit + 0x1c);
                *(float *)((long)local_600.ray + 0x50) = *(float *)(local_600.hit + 0x20);
              }
              else {
LAB_017fbac6:
                (ray->super_RayK<1>).tfar = (float)local_560._0_4_;
              }
              *(undefined4 *)(local_5a0 + uVar70 * 4) = 0;
              fVar129 = (ray->super_RayK<1>).tfar;
              auVar80._4_4_ = fVar129;
              auVar80._0_4_ = fVar129;
              auVar80._8_4_ = fVar129;
              auVar80._12_4_ = fVar129;
              auVar80._16_4_ = fVar129;
              auVar80._20_4_ = fVar129;
              auVar80._24_4_ = fVar129;
              auVar80._28_4_ = fVar129;
              auVar94 = vcmpps_avx(_local_540,auVar80,2);
              local_5a0 = vandps_avx(auVar94,local_5a0);
            }
            if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_5a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_5a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_5a0 >> 0x7f,0) == '\0') &&
                  (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_5a0 >> 0xbf,0) == '\0') &&
                (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_5a0[0x1f]) {
              return;
            }
            auVar95._8_4_ = 0x7f800000;
            auVar95._0_8_ = 0x7f8000007f800000;
            auVar95._12_4_ = 0x7f800000;
            auVar95._16_4_ = 0x7f800000;
            auVar95._20_4_ = 0x7f800000;
            auVar95._24_4_ = 0x7f800000;
            auVar95._28_4_ = 0x7f800000;
            auVar94 = vblendvps_avx(auVar95,_local_540,local_5a0);
            auVar77 = vshufps_avx(auVar94,auVar94,0xb1);
            auVar77 = vminps_avx(auVar94,auVar77);
            auVar151 = vshufpd_avx(auVar77,auVar77,5);
            auVar77 = vminps_avx(auVar77,auVar151);
            auVar151 = vpermpd_avx2(auVar77,0x4e);
            auVar77 = vminps_avx(auVar77,auVar151);
            auVar77 = vcmpps_avx(auVar94,auVar77,0);
            auVar151 = local_5a0 & auVar77;
            auVar94 = local_5a0;
            if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar151 >> 0x7f,0) != '\0') ||
                  (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar151 >> 0xbf,0) != '\0') ||
                (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar151[0x1f] < '\0') {
              auVar94 = vandps_avx(auVar77,local_5a0);
            }
            uVar68 = vmovmskps_avx(auVar94);
            uVar69 = 0;
            for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              uVar69 = uVar69 + 1;
            }
          } while( true );
        }
        local_5d0 = *(float *)(local_3c0 + uVar70 * 4);
        local_5cc = *(undefined4 *)(local_3a0 + uVar70 * 4);
        local_5c8 = *(undefined4 *)(local_380 + uVar70 * 4);
        local_5c4 = *(undefined4 *)(local_420 + uVar70 * 4);
        local_5c0 = *(undefined4 *)(local_400 + uVar70 * 4);
        local_5bc = (line->primIDs).field_0.i[uVar70];
        local_5b4 = context->user->instID[0];
        local_5b0 = context->user->instPrimID[0];
        local_340 = (ray->super_RayK<1>).tfar;
        (ray->super_RayK<1>).tfar = *(float *)(local_3e0 + uVar70 * 4);
        local_60c = -1;
        local_600.valid = &local_60c;
        local_600.geometryUserPtr = pGVar12->userPtr;
        local_600.context = context->user;
        local_600.ray = (RTCRayN *)ray;
        local_600.hit = (RTCHitN *)&local_5d0;
        local_600.N = 1;
        if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_017fb47d:
          p_Var14 = context->args->filter;
          if (p_Var14 != (RTCFilterFunctionN)0x0) {
            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
              (*p_Var14)(&local_600);
              auVar188 = ZEXT3264(local_520);
              auVar183 = ZEXT3264(local_320);
              auVar143 = ZEXT3264(local_300);
              auVar136 = ZEXT3264(local_2e0);
              auVar185 = ZEXT3264(local_2c0);
              auVar180 = ZEXT3264(_local_4a0);
              auVar177 = ZEXT3264(_local_480);
              auVar164 = ZEXT3264(local_460);
              auVar153 = ZEXT3264(local_440);
              auVar158 = ZEXT3264(CONCAT428(fStack_284,
                                            CONCAT424(fStack_288,
                                                      CONCAT420(fStack_28c,
                                                                CONCAT416(fStack_290,
                                                                          CONCAT412(fStack_294,
                                                                                    CONCAT48(
                                                  fStack_298,CONCAT44(fStack_29c,local_2a0))))))));
              context = local_608;
            }
            if (*local_600.valid == 0) goto LAB_017fb5e1;
          }
          (((Vec3f *)((long)local_600.ray + 0x30))->field_0).field_0.x = *(float *)local_600.hit;
          (((Vec3f *)((long)local_600.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_600.hit + 4);
          (((Vec3f *)((long)local_600.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_600.hit + 8);
          *(float *)((long)local_600.ray + 0x3c) = *(float *)(local_600.hit + 0xc);
          *(float *)((long)local_600.ray + 0x40) = *(float *)(local_600.hit + 0x10);
          *(float *)((long)local_600.ray + 0x44) = *(float *)(local_600.hit + 0x14);
          *(float *)((long)local_600.ray + 0x48) = *(float *)(local_600.hit + 0x18);
          *(float *)((long)local_600.ray + 0x4c) = *(float *)(local_600.hit + 0x1c);
          *(float *)((long)local_600.ray + 0x50) = *(float *)(local_600.hit + 0x20);
        }
        else {
          (*pGVar12->intersectionFilterN)(&local_600);
          auVar188 = ZEXT3264(local_520);
          auVar183 = ZEXT3264(local_320);
          auVar143 = ZEXT3264(local_300);
          auVar136 = ZEXT3264(local_2e0);
          auVar185 = ZEXT3264(local_2c0);
          auVar180 = ZEXT3264(_local_4a0);
          auVar177 = ZEXT3264(_local_480);
          auVar164 = ZEXT3264(local_460);
          auVar153 = ZEXT3264(local_440);
          auVar158 = ZEXT3264(CONCAT428(fStack_284,
                                        CONCAT424(fStack_288,
                                                  CONCAT420(fStack_28c,
                                                            CONCAT416(fStack_290,
                                                                      CONCAT412(fStack_294,
                                                                                CONCAT48(fStack_298,
                                                                                         CONCAT44(
                                                  fStack_29c,local_2a0))))))));
          context = local_608;
          if (*local_600.valid != 0) goto LAB_017fb47d;
LAB_017fb5e1:
          (ray->super_RayK<1>).tfar = local_340;
        }
        *(undefined4 *)(local_5a0 + uVar70 * 4) = 0;
        fVar129 = (ray->super_RayK<1>).tfar;
        auVar78._4_4_ = fVar129;
        auVar78._0_4_ = fVar129;
        auVar78._8_4_ = fVar129;
        auVar78._12_4_ = fVar129;
        auVar78._16_4_ = fVar129;
        auVar78._20_4_ = fVar129;
        auVar78._24_4_ = fVar129;
        auVar78._28_4_ = fVar129;
        auVar94 = vcmpps_avx(local_560,auVar78,2);
        local_5a0 = vandps_avx(auVar94,local_5a0);
      }
      auVar156 = auVar158._0_32_;
      auVar151 = auVar153._0_32_;
      auVar88 = auVar185._0_32_;
      auVar179 = auVar180._0_32_;
      auVar176 = auVar177._0_32_;
      auVar161 = auVar164._0_28_;
      auVar100 = auVar188._0_32_;
      auVar72 = auVar183._0_32_;
      auVar77 = auVar143._0_32_;
      auVar94 = auVar136._0_32_;
      if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_5a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_5a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_5a0 >> 0x7f,0) == '\0') &&
            (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_5a0 >> 0xbf,0) == '\0') &&
          (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_5a0[0x1f]) goto LAB_017fb6a9;
      auVar93._8_4_ = 0x7f800000;
      auVar93._0_8_ = 0x7f8000007f800000;
      auVar93._12_4_ = 0x7f800000;
      auVar93._16_4_ = 0x7f800000;
      auVar93._20_4_ = 0x7f800000;
      auVar93._24_4_ = 0x7f800000;
      auVar93._28_4_ = 0x7f800000;
      auVar94 = vblendvps_avx(auVar93,local_560,local_5a0);
      auVar77 = vshufps_avx(auVar94,auVar94,0xb1);
      auVar77 = vminps_avx(auVar94,auVar77);
      auVar151 = vshufpd_avx(auVar77,auVar77,5);
      auVar77 = vminps_avx(auVar77,auVar151);
      auVar151 = vpermpd_avx2(auVar77,0x4e);
      auVar77 = vminps_avx(auVar77,auVar151);
      auVar77 = vcmpps_avx(auVar94,auVar77,0);
      auVar151 = local_5a0 & auVar77;
      auVar94 = local_5a0;
      if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar151 >> 0x7f,0) != '\0') ||
            (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar151 >> 0xbf,0) != '\0') ||
          (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar151[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar77,local_5a0);
      }
      uVar68 = vmovmskps_avx(auVar94);
      uVar69 = 0;
      for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
        uVar69 = uVar69 + 1;
      }
      goto LAB_017fb2f4;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Intersect1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }